

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproxystyle.cpp
# Opt level: O0

SubControl __thiscall
QProxyStyle::hitTestComplexControl
          (QProxyStyle *this,ComplexControl control,QStyleOptionComplex *option,QPoint *pos,
          QWidget *widget)

{
  SubControl SVar1;
  QStyle *pQVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  QProxyStylePrivate *in_RDI;
  undefined8 in_R8;
  QProxyStylePrivate *d;
  
  d_func((QProxyStyle *)0x4093aa);
  QProxyStylePrivate::ensureBaseStyle(in_RDI);
  pQVar2 = QPointer<QStyle>::operator->((QPointer<QStyle> *)0x4093ca);
  SVar1 = (**(code **)(*(long *)pQVar2 + 0xd0))(pQVar2,in_ESI,in_RDX,in_RCX,in_R8);
  return SVar1;
}

Assistant:

QStyle::SubControl QProxyStyle::hitTestComplexControl(ComplexControl control, const QStyleOptionComplex *option, const QPoint &pos, const QWidget *widget) const
{
    Q_D (const QProxyStyle);
    d->ensureBaseStyle();
    return d->baseStyle->hitTestComplexControl(control, option, pos, widget);
}